

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

Amap_Lib_t * Amap_LibReadBuffer(char *pBuffer,int fVerbose)

{
  void **__ptr;
  Vec_Ptr_t *vTokens;
  Amap_Lib_t *pAVar1;
  int fVerbose_00;
  
  fVerbose_00 = 0;
  Amap_RemoveComments(pBuffer,(int *)0x0,(int *)0x0);
  vTokens = Amap_DeriveTokens(pBuffer);
  pAVar1 = Amap_ParseTokens(vTokens,fVerbose_00);
  __ptr = vTokens->pArray;
  if (pAVar1 == (Amap_Lib_t *)0x0) {
    if (__ptr != (void **)0x0) {
      free(__ptr);
      vTokens->pArray = (void **)0x0;
    }
    pAVar1 = (Amap_Lib_t *)0x0;
  }
  else if (__ptr != (void **)0x0) {
    free(__ptr);
    vTokens->pArray = (void **)0x0;
  }
  if (vTokens != (Vec_Ptr_t *)0x0) {
    free(vTokens);
  }
  return pAVar1;
}

Assistant:

Amap_Lib_t * Amap_LibReadBuffer( char * pBuffer, int fVerbose )
{
    Amap_Lib_t * pLib;
    Vec_Ptr_t * vTokens;
    Amap_RemoveComments( pBuffer, NULL, NULL );
    vTokens = Amap_DeriveTokens( pBuffer );
    pLib = Amap_ParseTokens( vTokens, fVerbose );
    if ( pLib == NULL )
    {
        Vec_PtrFree( vTokens );
        return NULL;
    }
    Vec_PtrFree( vTokens );
    return pLib;
}